

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O0

void __thiscall ValidateFootprint::ReadFootprintFile(ValidateFootprint *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  OASIS_FLOAT local_14;
  ValidateFootprint *pVStack_10;
  OASIS_FLOAT totalProbability;
  ValidateFootprint *this_local;
  
  local_14 = 0.0;
  pVStack_10 = this;
  ReadFirstFootprintLine(this,&local_14);
  if ((this->convertToBin_ & 1U) != 0) {
    (*this->_vptr_ValidateFootprint[1])();
  }
  while (pcVar3 = fgets((this->super_Validate).line_,0x1000,_stdin), pcVar3 != (char *)0x0) {
    iVar1 = ScanLine(this);
    if (iVar1 == 4) {
      iVar1 = Validate::CheckIDDoesNotExceedMaxLimit
                        (&this->super_Validate,this->eveIDName_,this->initialEveID_);
      (this->fr_).event_id = iVar1;
      uVar2 = Validate::CheckIDDoesNotExceedMaxLimit
                        (&this->super_Validate,this->areaperilIDName_,this->initialAreaperilID_);
      (this->fr_).super_EventRow.areaperil_id = uVar2;
      if (((this->fr_).event_id == this->prevEventID_) &&
         ((this->fr_).super_EventRow.areaperil_id == this->prevAreaPerilID_)) {
        CheckIntensityBins(this);
        local_14 = (this->fr_).super_EventRow.probability + local_14;
      }
      else {
        CheckProbability(this,local_14);
        CheckOrder(this);
        std::vector<int,_std::allocator<int>_>::clear(&this->intensityBinIDs_);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->intensityBinIDs_,&(this->fr_).super_EventRow.intensity_bin_id);
        local_14 = (this->fr_).super_EventRow.probability;
      }
      if ((this->convertToBin_ & 1U) == 0) {
        SetMaximumIntensityBinIndex(this);
      }
      else {
        if ((this->fr_).event_id != this->prevEventID_) {
          (*this->_vptr_ValidateFootprint[2])();
        }
        (*this->_vptr_ValidateFootprint[1])();
      }
      StoreLine(this);
    }
    else {
      fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
              (ulong)(uint)(this->super_Validate).lineno_,&this->super_Validate);
      Validate::PrintErrorMessage(&this->super_Validate);
    }
  }
  CheckProbability(this,local_14);
  CheckOrder(this);
  if ((this->convertToBin_ & 1U) != 0) {
    (*this->_vptr_ValidateFootprint[2])();
  }
  return;
}

Assistant:

void ValidateFootprint::ReadFootprintFile() {
/* After reading in a line from the csv file and checking for data integrity,
 * this method calls other methods to check:
 * 
 * - Total probability for each event ID-areaperil ID pair sums to 1.0.
 * - Event and areaperil IDs are in ascending order.
 * - Unique intensity bin IDs for each event ID-areaperil ID pair. */

  OASIS_FLOAT totalProbability = 0.0;
  ReadFirstFootprintLine(totalProbability);
  if (convertToBin_) WriteBinFootprintFile();   // Write first footprint line

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = CheckIDDoesNotExceedMaxLimit(eveIDName_, initialEveID_);
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      // If areaperil ID is of data type unsigned long long, it is not possible
      // to check for overflow
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = CheckIDDoesNotExceedMaxLimit(areaperilIDName_,
						      initialAreaperilID_);
#endif

      // New event and/or areaperil IDs.
      // Check probabilities sum to 1.0 for each event ID-areaperil ID
      // combination and event IDs and areaperil IDs are in ascending order.
      if ((fr_.event_id != prevEventID_) || 
	  (fr_.areaperil_id != prevAreaPerilID_)) {

        CheckProbability(totalProbability);
	CheckOrder();

	// Reset for next event
	intensityBinIDs_.clear();
	intensityBinIDs_.push_back(fr_.intensity_bin_id);
	totalProbability = fr_.probability;

      } else {

        CheckIntensityBins();
	totalProbability += fr_.probability;

      }

      if (convertToBin_) {

	if (fr_.event_id != prevEventID_) WriteIdxFootprintFile();
        WriteBinFootprintFile();

      } else {

        // Maximum intensity bin index value is required for binary conversion
	// in the future.
        SetMaximumIntensityBinIndex();

      }

      StoreLine();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // Check probabilities sum to 1.0 for last event ID-areaperil ID combination
  // and event IDs and areaperil IDs are in ascending order for last row
  CheckProbability(totalProbability);
  CheckOrder();
  // Write index row for last event ID-areaperil ID combination
  if (convertToBin_) WriteIdxFootprintFile();

}